

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O1

void Qentem::Test::TestTrimRight(QTest *test)

{
  QTest *pQVar1;
  ulong uVar2;
  long lVar3;
  uint local_40 [2];
  QTest *local_38;
  
  local_40[0] = 0;
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_40,local_40 + 1,0xf4);
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_40,local_40 + 1,0xf7);
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_40,local_40 + 1,0xfa);
  uVar2 = (ulong)local_40[0];
  if (uVar2 != 0) {
    do {
      if ((0x20 < (ulong)(byte)"   a"[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   a"[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_00102050;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    local_40[0] = 0;
  }
LAB_00102050:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_40,local_40 + 1,0xfd);
  uVar2 = (ulong)local_40[0];
  if (uVar2 != 0) {
    do {
      if ((0x20 < (ulong)(byte)"   abc"[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   abc"[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_001020a3;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    local_40[0] = 0;
  }
LAB_001020a3:
  local_40[1] = 0;
  local_38 = test;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,local_40,local_40 + 1,0x100);
  uVar2 = (ulong)local_40[0];
  if (1 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"  a "[uVar2 + 1]) ||
         ((0x100002600U >> ((ulong)(byte)"  a "[uVar2 + 1] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_00102100;
      }
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    local_40[0] = 1;
  }
LAB_00102100:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x103);
  uVar2 = (ulong)local_40[0];
  if (4 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"  abc "[uVar2 + 1]) ||
         ((0x100002600U >> ((ulong)(byte)"  abc "[uVar2 + 1] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_0010215b;
      }
      uVar2 = uVar2 - 1;
    } while (4 < uVar2);
    local_40[0] = 4;
  }
LAB_0010215b:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x106);
  uVar2 = (ulong)local_40[0];
  if (3 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   a  "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   a  "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_001021b4;
      }
      uVar2 = uVar2 - 1;
    } while (3 < uVar2);
    local_40[0] = 3;
  }
LAB_001021b4:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x109);
  uVar2 = (ulong)local_40[0];
  if (5 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   abc  "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   abc  "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_0010220f;
      }
      uVar2 = uVar2 - 1;
    } while (5 < uVar2);
    local_40[0] = 5;
  }
LAB_0010220f:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x10c);
  uVar2 = (ulong)local_40[0];
  if (4 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   a   "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   a   "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_0010226a;
      }
      uVar2 = uVar2 - 1;
    } while (4 < uVar2);
    local_40[0] = 4;
  }
LAB_0010226a:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x10f);
  uVar2 = (ulong)local_40[0];
  if (6 < uVar2) {
    do {
      if ((0x20 < (ulong)(byte)"   abc   "[uVar2 + 2]) ||
         ((0x100002600U >> ((ulong)(byte)"   abc   "[uVar2 + 2] & 0x3f) & 1) == 0)) {
        local_40[0] = (uint)uVar2;
        goto LAB_001022c6;
      }
      uVar2 = uVar2 - 1;
    } while (6 < uVar2);
    local_40[0] = 6;
  }
LAB_001022c6:
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x112);
  lVar3 = 2;
  do {
    if ((0x20 < (ulong)(byte)"  a "[lVar3 + 1]) ||
       ((0x100002600U >> ((ulong)(byte)"  a "[lVar3 + 1] & 0x3f) & 1) == 0)) goto LAB_0010231d;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_0010231d:
  local_40[0] = (uint)lVar3;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x116);
  lVar3 = 4;
  do {
    if ((0x20 < (ulong)(byte)"  abc "[lVar3 + 1]) ||
       ((0x100002600U >> ((ulong)(byte)"  abc "[lVar3 + 1] & 0x3f) & 1) == 0)) goto LAB_00102377;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102377:
  local_40[0] = (uint)lVar3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x11a);
  pQVar1 = local_38;
  lVar3 = 3;
  do {
    if ((0x20 < (ulong)(byte)"   a  "[lVar3 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   a  "[lVar3 + 2] & 0x3f) & 1) == 0)) goto LAB_001023cd;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_001023cd:
  local_40[0] = (uint)lVar3;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x11e);
  lVar3 = 5;
  do {
    if ((0x20 < (ulong)(byte)"   abc  "[lVar3 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc  "[lVar3 + 2] & 0x3f) & 1) == 0)) goto LAB_0010242a;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_0010242a:
  local_40[0] = (uint)lVar3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x122);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x126);
  lVar3 = 4;
  do {
    if ((0x20 < (ulong)(byte)"   a   "[lVar3 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   a   "[lVar3 + 2] & 0x3f) & 1) == 0)) goto LAB_001024a8;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_001024a8:
  local_40[0] = (uint)lVar3;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x12a);
  local_40[0] = 6;
  local_40[1] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x12e);
  uVar2 = 6;
  do {
    if ((0x20 < (ulong)(byte)"   abc   "[uVar2 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc   "[uVar2 + 2] & 0x3f) & 1) == 0)) goto LAB_00102524;
    uVar2 = uVar2 - 1;
  } while (3 < uVar2);
  uVar2 = 3;
LAB_00102524:
  local_40[0] = (uint)uVar2;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x132);
  uVar2 = 6;
  do {
    if ((0x20 < (ulong)(byte)"   abc   "[uVar2 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc   "[uVar2 + 2] & 0x3f) & 1) == 0)) goto LAB_00102580;
    uVar2 = uVar2 - 1;
  } while (2 < uVar2);
  uVar2 = 2;
LAB_00102580:
  local_40[0] = (uint)uVar2;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x136);
  pQVar1 = local_38;
  lVar3 = 6;
  do {
    if ((0x20 < (ulong)(byte)"   abc   "[lVar3 + 2]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc   "[lVar3 + 2] & 0x3f) & 1) == 0)) goto LAB_001025d8;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_001025d8:
  local_40[0] = (uint)lVar3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x13a);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x13e);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x142);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x146);
  local_40[0] = 0;
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x14a);
  local_40[0] = 1;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x14e);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x152);
  local_40[0] = 3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x156);
  local_40[0] = 5;
  local_40[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x15a);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x15e);
  pQVar1 = local_38;
  lVar3 = 3;
  do {
    if ((0x20 < (ulong)(byte)"`\n\n"[lVar3 + 3]) ||
       ((0x100002600U >> ((ulong)(byte)"`\n\n"[lVar3 + 3] & 0x3f) & 1) == 0)) goto LAB_00102764;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102764:
  local_40[0] = (uint)lVar3;
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x162);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x166);
  uVar2 = 3;
  do {
    if ((0x20 < (ulong)(byte)"`\n\n"[uVar2 + 3]) ||
       ((0x100002600U >> ((ulong)(byte)"`\n\n"[uVar2 + 3] & 0x3f) & 1) == 0)) goto LAB_001027e4;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  uVar2 = 1;
LAB_001027e4:
  local_40[0] = (uint)uVar2;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x16a);
  local_40[0] = 6;
  local_40[1] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x16e);
  local_40[0] = 5;
  local_40[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x172);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x176);
  lVar3 = 3;
  do {
    if ((0x20 < (ulong)(byte)"   a"[lVar3 + 4]) ||
       ((0x100002600U >> ((ulong)(byte)"   a"[lVar3 + 4] & 0x3f) & 1) == 0)) goto LAB_001028ac;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_001028ac:
  local_40[0] = (uint)lVar3;
  local_40[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x17a);
  uVar2 = 3;
  do {
    if ((0x20 < (ulong)(byte)"   a"[uVar2 + 4]) ||
       ((0x100002600U >> ((ulong)(byte)"   a"[uVar2 + 4] & 0x3f) & 1) == 0)) goto LAB_00102907;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  uVar2 = 1;
LAB_00102907:
  local_40[0] = (uint)uVar2;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x17e);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x182);
  lVar3 = 3;
  do {
    if ((0x20 < (ulong)(byte)"  a "[lVar3]) ||
       ((0x100002600U >> ((ulong)(byte)"  a "[lVar3] & 0x3f) & 1) == 0)) goto LAB_00102984;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102984:
  local_40[0] = (uint)lVar3;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x186);
  lVar3 = 5;
  do {
    if ((0x20 < (ulong)(byte)"  abc "[lVar3]) ||
       ((0x100002600U >> ((ulong)(byte)"  abc "[lVar3] & 0x3f) & 1) == 0)) goto LAB_001029e2;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_001029e2:
  local_40[0] = (uint)lVar3;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x18a);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x18e);
  lVar3 = 5;
  do {
    if ((0x20 < (ulong)(byte)"   a\n\r\t"[lVar3 + 1]) ||
       ((0x100002600U >> ((ulong)(byte)"   a\n\r\t"[lVar3 + 1] & 0x3f) & 1) == 0))
    goto LAB_00102a5b;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102a5b:
  local_40[0] = (uint)lVar3;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x192);
  lVar3 = 6;
  do {
    if ((0x20 < (ulong)(byte)"   abc  "[lVar3 + 1]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc  "[lVar3 + 1] & 0x3f) & 1) == 0)) goto LAB_00102ab9;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102ab9:
  local_40[0] = (uint)lVar3;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x196);
  lVar3 = 4;
  do {
    if ((0x20 < (ulong)(byte)"   a   "[lVar3]) ||
       ((0x100002600U >> ((ulong)(byte)"   a   "[lVar3] & 0x3f) & 1) == 0)) goto LAB_00102b14;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102b14:
  local_40[0] = (uint)lVar3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x19a);
  pQVar1 = local_38;
  lVar3 = 8;
  do {
    if ((0x20 < (ulong)(byte)"   abc   "[lVar3]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc   "[lVar3] & 0x3f) & 1) == 0)) goto LAB_00102b72;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = 0;
LAB_00102b72:
  local_40[0] = (uint)lVar3;
  local_40[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(local_38,local_40,local_40 + 1,0x19e);
  local_40[0] = 1;
  local_40[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1a2);
  local_40[0] = 2;
  local_40[1] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1a6);
  local_40[0] = 3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1aa);
  local_40[0] = 3;
  local_40[1] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1ae);
  local_40[0] = 5;
  local_40[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1b2);
  local_40[0] = 4;
  local_40[1] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1b6);
  local_40[0] = 6;
  local_40[1] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1ba);
  local_40[0] = 6;
  local_40[1] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1be);
  uVar2 = 8;
  do {
    if ((0x20 < (ulong)(byte)"   abc   "[uVar2]) ||
       ((0x100002600U >> ((ulong)(byte)"   abc   "[uVar2] & 0x3f) & 1) == 0)) goto LAB_00102cec;
    uVar2 = uVar2 - 1;
  } while (4 < uVar2);
  uVar2 = 4;
LAB_00102cec:
  local_40[0] = (uint)uVar2;
  local_40[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,local_40,local_40 + 1,0x1c2);
  return;
}

Assistant:

static void TestTrimRight(QTest &test) {
    SizeT32 end_offset = 0;

    StringUtils::TrimRight("", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 10U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a ", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a  ", 3U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc  ", 5U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("a ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("abc ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("a  ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 2U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("  a", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("  abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" a\n\r\t", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("  a   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" ", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("  ", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 5U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 7;
    StringUtils::TrimRight("  a    ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 4U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);
}